

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

SslTcpSocket * __thiscall
SslTcpServerImpl::MakeClientConnection(SslTcpServerImpl *this,int32_t *fSock)

{
  BaseSocket *pBVar1;
  SslTcpSocketImpl *pSVar2;
  size_type sVar3;
  pointer pBVar4;
  BaseSocketImpl *pBVar5;
  pointer pSVar6;
  void *local_1e0;
  TcpServer *local_1b8;
  TcpSocketImpl *local_1a8;
  SslTcpSocketImpl *local_198;
  lock_guard<std::mutex> local_170;
  lock_guard<std::mutex> lock;
  code *pcStack_160;
  int iErrNo;
  undefined8 local_158;
  type local_150;
  code *local_138;
  undefined8 local_130;
  type local_128;
  offset_in_BaseSocketImpl_to_subr local_110 [2];
  type local_100;
  function<void_()> local_e8;
  code *local_c8;
  undefined8 local_c0;
  thread local_b8;
  undefined1 local_b0 [16];
  SslTcpSocketImpl *pSslTcpSocketImpl;
  SslTcpSocket *pSslTcpSock;
  unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> local_90;
  unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> pSslTcpSocket;
  SslServerContext local_78;
  int32_t *local_18;
  int32_t *fSock_local;
  SslTcpServerImpl *this_local;
  
  local_18 = fSock;
  fSock_local = (int32_t *)this;
  sVar3 = std::
          vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
          ::size(&this->m_SslCtx);
  if (sVar3 == 0) {
    OpenSSLWrapper::SslServerContext::SslServerContext(&local_78);
    std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
    ::emplace_back<OpenSSLWrapper::SslServerContext>(&this->m_SslCtx,&local_78);
    OpenSSLWrapper::SslServerContext::~SslServerContext(&local_78);
  }
  std::make_unique<SslTcpSocket>();
  std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>::
  unique_ptr<SslTcpSocket,std::default_delete<SslTcpSocket>,void>
            ((unique_ptr<BaseSocket,std::default_delete<BaseSocket>> *)&local_90,
             (unique_ptr<SslTcpSocket,_std::default_delete<SslTcpSocket>_> *)&pSslTcpSock);
  std::unique_ptr<SslTcpSocket,_std::default_delete<SslTcpSocket>_>::~unique_ptr
            ((unique_ptr<SslTcpSocket,_std::default_delete<SslTcpSocket>_> *)&pSslTcpSock);
  pBVar4 = std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>::get(&local_90);
  if (pBVar4 == (pointer)0x0) {
    local_198 = (SslTcpSocketImpl *)0x0;
  }
  else {
    local_198 = (SslTcpSocketImpl *)
                __dynamic_cast(pBVar4,&BaseSocket::typeinfo,&SslTcpSocket::typeinfo,0);
  }
  pSslTcpSocketImpl = local_198;
  pBVar5 = BaseSocket::GetImpl((BaseSocket *)local_198);
  if (pBVar5 == (BaseSocketImpl *)0x0) {
    local_1a8 = (TcpSocketImpl *)0x0;
  }
  else {
    local_1a8 = (TcpSocketImpl *)
                __dynamic_cast(pBVar5,&BaseSocketImpl::typeinfo,&SslTcpSocketImpl::typeinfo,0);
  }
  local_b0._8_8_ = local_1a8;
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  front(&this->m_SslCtx);
  std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslServerContext&>
            ((SslServerContext *)local_b0);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  operator=((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             *)&(((TcpSocketImpl *)(local_b0._8_8_ + 0x420))->super_BaseSocketImpl).m_mxWrite.
                super___mutex_base._M_mutex.__data.__list.__next,
            (unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             *)local_b0);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)local_b0);
  ((BaseSocketImpl *)local_b0._8_8_)->m_fSock = *local_18;
  std::__atomic_base<unsigned_char>::operator=
            (&(((BaseSocketImpl *)local_b0._8_8_)->m_iShutDownState).
              super___atomic_base<unsigned_char>,'\a');
  pBVar1 = (this->super_TcpServerImpl).super_BaseSocketImpl.m_pBkRef;
  if (pBVar1 == (BaseSocket *)0x0) {
    local_1b8 = (TcpServer *)0x0;
  }
  else {
    local_1b8 = (TcpServer *)__dynamic_cast(pBVar1,&BaseSocket::typeinfo,&SslTcpServer::typeinfo,0);
  }
  *(TcpServer **)(local_b0._8_8_ + 0x328) = local_1b8;
  local_c8 = TcpSocketImpl::WriteThread;
  local_c0 = 0;
  std::thread::thread<void(TcpSocketImpl::*)(),SslTcpSocketImpl*&,void>
            (&local_b8,(type *)&local_c8,(SslTcpSocketImpl **)(local_b0 + 8));
  std::thread::operator=(&((BaseSocketImpl *)local_b0._8_8_)->m_thWrite,&local_b8);
  std::thread::~thread(&local_b8);
  pSVar6 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         *)&(((TcpSocketImpl *)(local_b0._8_8_ + 0x420))->super_BaseSocketImpl).
                            m_mxWrite.super___mutex_base._M_mutex.__data.__list.__next);
  local_110[1] = 0;
  local_110[0] = 0x11;
  std::bind<void(BaseSocketImpl::*)(),SslTcpSocketImpl*&>
            (&local_100,local_110,(SslTcpSocketImpl **)(local_b0 + 8));
  std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslTcpSocketImpl*))()>,void>
            ((function<void()> *)&local_e8,&local_100);
  OpenSSLWrapper::SslConnection::SetErrorCb(pSVar6,&local_e8);
  std::function<void_()>::~function(&local_e8);
  pSVar6 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         *)&(((TcpSocketImpl *)(local_b0._8_8_ + 0x420))->super_BaseSocketImpl).
                            m_mxWrite.super___mutex_base._M_mutex.__data.__list.__next);
  OpenSSLWrapper::SslConnection::SetUserData(pSVar6,0,SslTcpSocketImpl::fnForwarder_abi_cxx11_);
  pSVar6 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         *)&(((TcpSocketImpl *)(local_b0._8_8_ + 0x420))->super_BaseSocketImpl).
                            m_mxWrite.super___mutex_base._M_mutex.__data.__list.__next);
  pBVar5 = BaseSocket::GetImpl((BaseSocket *)pSslTcpSocketImpl);
  if (pBVar5 == (BaseSocketImpl *)0x0) {
    local_1e0 = (void *)0x0;
  }
  else {
    local_1e0 = (void *)__dynamic_cast(pBVar5,&BaseSocketImpl::typeinfo,&SslTcpSocketImpl::typeinfo,
                                       0);
  }
  OpenSSLWrapper::SslConnection::SetUserData(pSVar6,1,local_1e0);
  local_138 = SslTcpSocketImpl::DatenEncode;
  local_130 = 0;
  std::
  bind<int(SslTcpSocketImpl::*)(unsigned_char_const*,unsigned_long),SslTcpSocketImpl*&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_128,(offset_in_SslTcpSocketImpl_to_subr *)&local_138,
             (SslTcpSocketImpl **)(local_b0 + 8),(_Placeholder<1> *)&std::placeholders::_1,
             (_Placeholder<2> *)&std::placeholders::_2);
  std::function<int(unsigned_char_const*,unsigned_long)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long)> *)(local_b0._8_8_ + 0x248),
             &local_128);
  pcStack_160 = SslTcpSocketImpl::DatenDecode;
  local_158 = 0;
  std::
  bind<int(SslTcpSocketImpl::*)(unsigned_char_const*,unsigned_long,bool&),SslTcpSocketImpl*&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_150,(offset_in_SslTcpSocketImpl_to_subr *)&stack0xfffffffffffffea0,
             (SslTcpSocketImpl **)(local_b0 + 8),(_Placeholder<1> *)&std::placeholders::_1,
             (_Placeholder<2> *)&std::placeholders::_2,(_Placeholder<3> *)&std::placeholders::_3);
  std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)(local_b0._8_8_ + 0x1a8),
             &local_150);
  pSVar6 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         *)&(((TcpSocketImpl *)(local_b0._8_8_ + 0x420))->super_BaseSocketImpl).
                            m_mxWrite.super___mutex_base._M_mutex.__data.__list.__next);
  OpenSSLWrapper::SslConnection::SSLSetAcceptState(pSVar6);
  (*((BaseSocketImpl *)local_b0._8_8_)->_vptr_BaseSocketImpl[0xe])(local_b0._8_8_,local_18);
  TcpSocketImpl::GetConnectionInfo((TcpSocketImpl *)local_b0._8_8_);
  std::lock_guard<std::mutex>::lock_guard(&local_170,&BaseSocketImpl::s_mxClientSocket);
  std::
  deque<std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>,_std::allocator<std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>_>_>
  ::push_back(&BaseSocketImpl::s_lstClientSocket,&local_90);
  pSVar2 = pSslTcpSocketImpl;
  std::lock_guard<std::mutex>::~lock_guard(&local_170);
  std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>::~unique_ptr(&local_90);
  return (SslTcpSocket *)pSVar2;
}

Assistant:

SslTcpSocket* SslTcpServerImpl::MakeClientConnection(const SOCKET& fSock)
{
    if (m_SslCtx.size() == 0)
        m_SslCtx.emplace_back(SslServerContext());

    unique_ptr<BaseSocket> pSslTcpSocket = make_unique<SslTcpSocket>();
    SslTcpSocket* pSslTcpSock = dynamic_cast<SslTcpSocket*>(pSslTcpSocket.get());
    SslTcpSocketImpl* pSslTcpSocketImpl = dynamic_cast<SslTcpSocketImpl*>(pSslTcpSock->GetImpl());

    try
    {
        pSslTcpSocketImpl->m_pSslCon = make_unique<SslConnection>(m_SslCtx.front());

        pSslTcpSocketImpl->m_fSock = fSock;
        pSslTcpSocketImpl->m_iShutDownState = 7;
        pSslTcpSocketImpl->m_pRefServSocket = dynamic_cast<SslTcpServer*>(m_pBkRef);
        pSslTcpSocketImpl->m_thWrite = thread(&TcpSocketImpl::WriteThread, pSslTcpSocketImpl);

        pSslTcpSocketImpl->m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, pSslTcpSocketImpl)));
        pSslTcpSocketImpl->m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
        pSslTcpSocketImpl->m_pSslCon->SetUserData(1, dynamic_cast<SslTcpSocketImpl*>(pSslTcpSock->GetImpl()));
        pSslTcpSocketImpl->m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, pSslTcpSocketImpl, _1, _2);
        pSslTcpSocketImpl->m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, pSslTcpSocketImpl, _1, _2, _3);

        pSslTcpSocketImpl->m_pSslCon->SSLSetAcceptState();

        pSslTcpSocketImpl->SetSocketOption(fSock);
        pSslTcpSocketImpl->GetConnectionInfo();
    }

    catch (const int iErrNo)
    {
        pSslTcpSocketImpl->SetErrorNo(iErrNo);
    }

    lock_guard<mutex> lock(s_mxClientSocket);
    s_lstClientSocket.push_back(move(pSslTcpSocket));

    return pSslTcpSock;
}